

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdCreateKeyPair(void *handle,bool is_compressed,int network_type,char **pubkey,char **privkey,
                    char **wif)

{
  undefined8 uVar1;
  undefined8 *in_RCX;
  byte in_SIL;
  undefined8 *in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  Privkey key;
  string privkey_wif;
  Pubkey pubkey_obj;
  KeyApi api;
  NetType_conflict net_type;
  bool is_bitcoin;
  char *work_wif;
  char *work_privkey;
  char *work_pubkey;
  string *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe90;
  NetType in_stack_fffffffffffffebc;
  string *in_stack_fffffffffffffec0;
  Pubkey *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  string local_118;
  Privkey local_f8;
  string local_d8 [32];
  Pubkey local_b8;
  KeyApi local_9b;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  NetType local_5c;
  byte local_55;
  char *local_48;
  char *local_40;
  char *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  byte local_11;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_11 = in_SIL & 1;
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  cfd::Initialize();
  local_55 = 1;
  local_5c = cfd::capi::ConvertNetType(in_stack_fffffffffffffed4,(bool *)in_stack_fffffffffffffec8);
  if ((local_55 & 1) == 0) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x3f3;
    local_78.funcname = "CfdCreateKeyPair";
    cfd::core::logger::warn<>(&local_78,"privkey\'s network_type is invalid.");
    local_9a = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,"Failed to parameter. privkey\'s network_type is invalid.",&local_99);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe90,error_code,in_stack_fffffffffffffe80);
    local_9a = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::api::KeyApi::KeyApi(&local_9b);
  cfd::core::Pubkey::Pubkey(&local_b8);
  std::__cxx11::string::string(local_d8);
  cfd::api::KeyApi::CreateKeyPair
            ((KeyApi *)in_stack_fffffffffffffed8,SUB41((uint)in_stack_fffffffffffffed4 >> 0x18,0),
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  if (local_30 != (undefined8 *)0x0) {
    local_48 = cfd::capi::CreateString
                         ((string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  if (local_28 != (undefined8 *)0x0) {
    cfd::core::Privkey::GetHex_abi_cxx11_(&local_118,&local_f8);
    local_40 = cfd::capi::CreateString
                         ((string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    std::__cxx11::string::~string((string *)&local_118);
  }
  if (local_20 != (undefined8 *)0x0) {
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffec8,&local_b8);
    local_38 = cfd::capi::CreateString
                         ((string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
  }
  if (local_40 != (char *)0x0) {
    *local_28 = local_40;
  }
  if (local_48 != (char *)0x0) {
    *local_30 = local_48;
  }
  if (local_38 != (char *)0x0) {
    *local_20 = local_38;
  }
  local_4 = 0;
  cfd::core::Privkey::~Privkey((Privkey *)0x605ef3);
  std::__cxx11::string::~string(local_d8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x605f0d);
  return local_4;
}

Assistant:

int CfdCreateKeyPair(
    void* handle, bool is_compressed, int network_type, char** pubkey,
    char** privkey, char** wif) {
  char* work_pubkey = nullptr;
  char* work_privkey = nullptr;
  char* work_wif = nullptr;
  try {
    cfd::Initialize();

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }

    KeyApi api;
    Pubkey pubkey_obj;
    std::string privkey_wif;
    Privkey key =
        api.CreateKeyPair(is_compressed, &pubkey_obj, &privkey_wif, net_type);

    if (wif != nullptr) {
      work_wif = CreateString(privkey_wif);
    }
    if (privkey != nullptr) {
      work_privkey = CreateString(key.GetHex());
    }
    if (pubkey != nullptr) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    }

    if (work_privkey != nullptr) *privkey = work_privkey;
    if (work_wif != nullptr) *wif = work_wif;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_privkey, &work_wif, &work_pubkey);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_privkey, &work_wif, &work_pubkey);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_privkey, &work_wif, &work_pubkey);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}